

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

byte * __thiscall slang::BumpAllocator::allocate(BumpAllocator *this,size_t size,size_t alignment)

{
  Segment *pSVar1;
  Segment *pSVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)(-alignment & (ulong)(this->head->current + (alignment - 1)));
  pbVar3 = pbVar4 + size;
  if (pbVar3 <= this->endPtr) {
    this->head->current = pbVar3;
    return pbVar4;
  }
  if (0x800 < size) {
    pSVar1 = this->head->prev;
    pSVar2 = (Segment *)operator_new(((alignment + size) - 1 & -alignment) + 0x10);
    pSVar2->prev = pSVar1;
    pSVar2->current = (byte *)(pSVar2 + 1);
    this->head->prev = pSVar2;
    return (byte *)((long)&pSVar2->current + alignment + 7 & -alignment);
  }
  pSVar1 = this->head;
  pSVar2 = (Segment *)operator_new(0x1000);
  pSVar2->prev = pSVar1;
  pSVar2->current = (byte *)(pSVar2 + 1);
  this->head = pSVar2;
  this->endPtr = (byte *)(pSVar2 + 0x100);
  pbVar3 = allocate(this,size,alignment);
  return pbVar3;
}

Assistant:

byte* allocate(size_t size, size_t alignment) {
        SLANG_ASSERT(!isFrozen());
        byte* base = alignPtr(head->current, alignment);
        byte* next = base + size;
        if (next > endPtr)
            return allocateSlow(size, alignment);

        head->current = next;
        return base;
    }